

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr c4::yml::from_next_line(csubstr rem)

{
  char cVar1;
  ro_substr chars;
  csubstr cVar2;
  bool bVar3;
  error_flags eVar4;
  ulong in_RSI;
  char nl;
  size_t nlpos;
  bool local_144;
  size_t in_stack_fffffffffffffec0;
  basic_substring<const_char> *len_;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  undefined1 uVar5;
  basic_substring<const_char> *in_stack_fffffffffffffed0;
  basic_substring<const_char> *pbVar6;
  bool local_122;
  size_t in_stack_fffffffffffffef0;
  basic_substring<const_char> *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  basic_substring<char_const> local_e0 [16];
  size_t local_d0;
  basic_substring<const_char> local_c8;
  basic_substring<const_char> local_b8;
  basic_substring<const_char> *local_a8;
  char *local_a0;
  undefined4 local_98;
  undefined8 local_90;
  basic_substring<const_char> *local_88;
  char *local_80;
  size_t local_78;
  char *local_70;
  undefined4 local_68;
  size_t local_60;
  basic_substring<const_char> *local_58;
  char *local_50;
  undefined4 local_48;
  ulong local_40;
  basic_substring<const_char> *local_38;
  char *local_30;
  size_t local_28;
  char local_1a;
  char local_19;
  char *local_18;
  undefined4 local_10;
  basic_substring<const_char> *local_8;
  
  local_c8.len = in_RSI;
  basic_substring<char_const>::basic_substring<3ul>(local_e0,(char (*) [3])0x38bda2);
  chars.len = in_stack_ffffffffffffff08;
  chars.str = in_stack_ffffffffffffff00;
  local_d0 = basic_substring<const_char>::first_of
                       (in_stack_fffffffffffffef8,chars,in_stack_fffffffffffffef0);
  if (local_d0 == 0xffffffffffffffff) {
    basic_substring<const_char>::basic_substring(&local_b8);
  }
  else {
    pbVar6 = &local_c8;
    local_60 = local_d0;
    local_58 = pbVar6;
    if (local_c8.len <= local_d0) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      local_70 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_68 = 0x14c3;
      handle_error(0x389522,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    cVar1 = pbVar6->str[local_60];
    local_38 = &local_c8;
    local_40 = local_d0;
    if (local_c8.len < local_d0 && local_d0 != 0xffffffffffffffff) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
        trap_instruction();
      }
      local_50 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_48 = 0x157b;
      handle_error(0x389522,(char *)0x157b,"check failed: %s","pos <= len || pos == npos");
    }
    if (local_40 == 0xffffffffffffffff) {
      basic_substring<const_char>::basic_substring
                (in_stack_fffffffffffffed0,
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
    }
    else {
      basic_substring<const_char>::basic_substring
                (in_stack_fffffffffffffed0,
                 (char *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
    }
    local_c8.str = local_30;
    local_c8.len = local_28;
    pbVar6 = &local_c8;
    local_122 = local_28 == 0 || local_30 == (char *)0x0;
    local_a8 = pbVar6;
    if (local_122) {
      basic_substring<const_char>::basic_substring(&local_b8);
    }
    else {
      len_ = &local_c8;
      uVar5 = local_28 != 0 && local_30 != (char *)0x0;
      local_8 = len_;
      if (local_28 == 0 || local_30 == (char *)0x0) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          trap_instruction();
        }
        local_18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_10 = 0x14c6;
        handle_error(0x389522,(char *)0x14c6,"check failed: %s","len > 0 && str != nullptr");
      }
      local_1a = *len_->str;
      if ((cVar1 != '\n') || (local_144 = true, local_1a != '\r')) {
        local_144 = cVar1 == '\r' && local_1a == '\n';
      }
      if (local_144) {
        local_88 = &local_c8;
        local_90 = 1;
        local_19 = cVar1;
        if (local_c8.len == 0) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            trap_instruction();
          }
          local_a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_98 = 0x1533;
          handle_error(0x389522,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (pbVar6,(char *)CONCAT17(uVar5,in_stack_fffffffffffffec8),(size_t)len_);
        local_c8.str = local_80;
        local_c8.len = local_78;
      }
      local_b8.str = local_c8.str;
      local_b8.len = local_c8.len;
    }
  }
  cVar2.len = local_b8.len;
  cVar2.str = local_b8.str;
  return cVar2;
}

Assistant:

csubstr from_next_line(csubstr rem)
{
    size_t nlpos = rem.first_of("\r\n");
    if(nlpos == csubstr::npos)
        return {};
    const char nl = rem[nlpos];
    rem = rem.right_of(nlpos);
    if(rem.empty())
        return {};
    if(_extend_from_combined_newline(nl, rem.front()))
        rem = rem.sub(1);
    return rem;
}